

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginListBox(char *label,ImVec2 *size_arg)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID id;
  ImGuiContext *g;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  float fVar13;
  ImVec2 IVar12;
  float fVar14;
  float local_98;
  float fStack_94;
  float local_78;
  ImVec2 local_58;
  ImRect bb;
  ImRect local_40;
  
  pIVar4 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar2 = pIVar4->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    id = GetID(label);
    IVar11 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar13 = IVar11.y;
    IVar1 = *size_arg;
    fVar8 = CalcItemWidth();
    fVar9 = GetTextLineHeightWithSpacing();
    fVar10 = (pIVar4->Style).FramePadding.y;
    IVar12 = CalcItemSize(IVar1,fVar8,fVar10 + fVar10 + fVar9 * 7.25);
    uVar6 = -(uint)(fVar13 <= (float)(int)IVar12.y);
    IVar3 = (pIVar2->DC).CursorPos;
    fVar10 = 0.0;
    local_78 = IVar11.x;
    IVar1 = (pIVar2->DC).CursorPos;
    fVar8 = IVar1.x + (float)(int)IVar12.x;
    fVar9 = IVar1.y + (float)(uVar6 & (uint)(float)(int)IVar12.y | ~uVar6 & (uint)fVar13);
    if (0.0 < local_78) {
      fVar10 = (pIVar4->Style).ItemInnerSpacing.x + local_78;
    }
    bb.Max.x = fVar10 + fVar8;
    bb.Max.y = fVar9 + 0.0;
    (pIVar4->NextItemData).Flags = 0;
    bb.Min = IVar3;
    local_40.Min = IVar3;
    local_40.Max.x = fVar8;
    local_40.Max.y = fVar9;
    bVar5 = IsRectVisible(&bb.Min,&bb.Max);
    if (bVar5) {
      BeginGroup();
      fStack_94 = IVar3.y;
      if (0.0 < local_78) {
        IVar11.x = (pIVar4->Style).ItemInnerSpacing.x + fVar8;
        IVar11.y = (pIVar4->Style).FramePadding.y + fStack_94;
        RenderText(IVar11,label,(char *)0x0,true);
        IVar1 = (pIVar2->DC).CursorMaxPos;
        fVar10 = IVar1.x;
        fVar14 = IVar1.y;
        uVar6 = -(uint)(local_78 + IVar11.x <= fVar10);
        uVar7 = -(uint)(fVar13 + IVar11.y <= fVar14);
        (pIVar2->DC).CursorMaxPos =
             (ImVec2)(CONCAT44(~uVar7 & (uint)(fVar13 + IVar11.y),
                               ~uVar6 & (uint)(local_78 + IVar11.x)) |
                     CONCAT44((uint)fVar14 & uVar7,(uint)fVar10 & uVar6));
      }
      local_98 = IVar3.x;
      local_58.x = fVar8 - local_98;
      local_58.y = fVar9 - fStack_94;
      BeginChildFrame(id,&local_58,0);
    }
    else {
      local_58.x = bb.Max.x - bb.Min.x;
      local_58.y = bb.Max.y - bb.Min.y;
      ItemSize(&local_58,(pIVar4->Style).FramePadding.y);
      ItemAdd(&bb,0,&local_40,0);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginListBox(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7.25 items.
    // Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = ImFloor(CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.25f + style.FramePadding.y * 2.0f));
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    // FIXME-OPT: We could omit the BeginGroup() if label_size.x but would need to omit the EndGroup() as well.
    BeginGroup();
    if (label_size.x > 0.0f)
    {
        ImVec2 label_pos = ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y);
        RenderText(label_pos, label);
        window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, label_pos + label_size);
    }

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}